

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O1

int get_offset_field(flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
                    flatbuffers_uoffset_t *out)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = id * 2 + 4;
  if (uVar1 < td->vsize) {
    uVar1 = *(ushort *)((long)td->vtable + (ulong)uVar1);
  }
  else {
    uVar1 = 0;
  }
  if (uVar1 != 0) {
    iVar2 = 0xd;
    if (uVar1 + 4 <= (uint)td->tsize) {
      uVar3 = (uint)uVar1 + td->table;
      if ((uVar3 & 3) != 0) {
        return (uVar3 & 3) == 0 | 0xc;
      }
      *out = uVar3;
      iVar2 = 0;
    }
    return iVar2;
  }
  *out = 0;
  return (uint)(required != 0) << 2;
}

Assistant:

static int get_offset_field(flatcc_table_verifier_descriptor_t *td, voffset_t id, int required, uoffset_t *out)
{
    uoffset_t k, k2;
    voffset_t vte;

    vte = read_vt_entry(td, id);
    if (!vte) {
        *out = 0;
        if (required) {
            return flatcc_verify_error_required_field_missing;
        }
        /* Missing, but not invalid. */
        return flatcc_verify_ok;
    }
    /*
     * Note that we don't add td.table to k and we test against table
     * size not table end or buffer end. Otherwise it would not be safe
     * to optimized out the k <= k2 check for normal uoffset and voffset
     * configurations.
     */
    k = vte;
    k2 = k + offset_size;
    verify(k2 <= td->tsize, flatcc_verify_error_table_field_out_of_range);
    /* This normally optimizes to nop. */
    verify(uoffset_size > voffset_size || k <= k2, flatcc_verify_error_table_field_size_overflow);
    k += td->table;
    verify(!(k & (offset_size - 1u)), flatcc_verify_error_table_field_not_aligned);
    /* We assume the table size has already been verified. */
    *out = k;
    return flatcc_verify_ok;
}